

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,uint128 *value)

{
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream str;
  uint128 *value_local;
  LogMessage *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  protobuf::operator<<((ostream *)local_190,value);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)&this->message_,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const uint128& value) {
  std::ostringstream str;
  str << value;
  message_ += str.str();
  return *this;
}